

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeUtilities.cpp
# Opt level: O3

bool __thiscall
soul::SimpleTokeniser::skipPastMatchingCloseDelimiter
          (SimpleTokeniser *this,TokenType openDelim,TokenType closeDelim)

{
  int iVar1;
  TokenType __s1;
  int iVar2;
  char *__s1_00;
  
  __s1_00 = (this->super_SOULTokeniser).currentType.text;
  iVar2 = 0;
  if (__s1_00 != "$eof") {
    do {
      if ((__s1_00 != (char *)0x0) && (iVar1 = strcmp(__s1_00,"$eof"), iVar1 == 0)) break;
      __s1 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
             ::skip(&this->super_SOULTokeniser);
      if ((__s1.text == openDelim.text) ||
         ((__s1.text != (char *)0x0 && openDelim.text != (char *)0x0 &&
          (iVar1 = strcmp(__s1.text,openDelim.text), iVar1 == 0)))) {
        iVar2 = iVar2 + 1;
      }
      else if (((__s1.text == closeDelim.text) ||
               ((closeDelim.text != (char *)0x0 && __s1.text != (char *)0x0 &&
                (iVar1 = strcmp(__s1.text,closeDelim.text), iVar1 == 0)))) &&
              (iVar2 = iVar2 + -1, iVar2 == 0)) {
        iVar2 = 1;
        goto LAB_001c4446;
      }
      __s1_00 = (this->super_SOULTokeniser).currentType.text;
    } while (__s1_00 != "$eof");
    iVar2 = 0;
  }
LAB_001c4446:
  return SUB41(iVar2,0);
}

Assistant:

bool skipPastMatchingCloseDelimiter (TokenType openDelim, TokenType closeDelim)
    {
        int depth = 0;

        for (;;)
        {
            if (matches (Token::eof))
                return false;

            auto token = skip();

            if (token == openDelim)
            {
                ++depth;
            }
            else if (token == closeDelim)
            {
                if (--depth == 0)
                    return true;
            }
        }
    }